

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O2

void __thiscall
cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge>::insert
          (cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge> *this,cbtInternalVertexPair *key,
          cbtInternalEdge *value)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  
  sVar1 = key->m_v0;
  sVar2 = key->m_v1;
  iVar3 = (this->m_valueArray).m_capacity;
  iVar6 = findIndex(this,key);
  if (iVar6 == -1) {
    iVar6 = (this->m_valueArray).m_size;
    iVar4 = (this->m_valueArray).m_capacity;
    cbtAlignedObjectArray<cbtInternalEdge>::push_back(&this->m_valueArray,value);
    cbtAlignedObjectArray<cbtInternalVertexPair>::push_back(&this->m_keyArray,key);
    if (iVar4 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar7 = (this->m_valueArray).m_capacity - 1U &
              (uint)(ushort)key->m_v1 * 0x10000 + (int)key->m_v0;
    }
    else {
      uVar7 = iVar3 - 1U & sVar2 * 0x10000 + (int)sVar1;
    }
    piVar5 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar6] = piVar5[(int)uVar7];
    piVar5[(int)uVar7] = iVar6;
  }
  else {
    (this->m_valueArray).m_data[iVar6] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		int hash = key.getHash() & (m_valueArray.capacity() - 1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index] = value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity() - 1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}